

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int select_off(obj *otmp)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_158;
  char local_128 [8];
  char buf [256];
  obj *local_20;
  obj *why;
  obj *otmp_local;
  
  if (otmp == (obj *)0x0) {
    return 0;
  }
  local_128[0] = '\0';
  if ((otmp == uright) || (otmp == uleft)) {
    if (((youmonst.data)->mflags1 & 0x6000) == 0x6000) {
      pline("The ring is stuck.");
      return 0;
    }
    local_20 = (obj *)0x0;
    iVar2 = welded(uwep);
    if ((iVar2 == 0) ||
       ((otmp != uright &&
        (((uwep->oclass != '\x02' && (uwep->oclass != '\x06')) ||
         ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) == 0)))))) {
      if ((uarmg != (obj *)0x0) && ((*(uint *)&uarmg->field_0x4a & 1) != 0)) {
        sprintf(local_128,"take off your %s","gloves");
        local_20 = uarmg;
      }
    }
    else {
      pcVar3 = body_part(6);
      sprintf(local_128,"free a weapon %s",pcVar3);
      local_20 = uwep;
    }
    if (local_20 != (obj *)0x0) {
      pline("You cannot %s to remove the ring.",local_128);
      *(uint *)&local_20->field_0x4a = *(uint *)&local_20->field_0x4a & 0xffffffbf | 0x40;
      return 0;
    }
  }
  if (otmp == uarmg) {
    iVar2 = welded(uwep);
    if (iVar2 != 0) {
      bVar1 = false;
      if ((uwep->oclass == '\x02') && (bVar1 = false, '\x04' < objects[uwep->otyp].oc_subtyp)) {
        bVar1 = objects[uwep->otyp].oc_subtyp < '\v';
      }
      pcVar3 = "weapon";
      if (bVar1) {
        pcVar3 = "sword";
      }
      pline("You are unable to take off your %s while wielding that %s.","gloves",pcVar3);
      *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a & 0xffffffbf | 0x40;
      return 0;
    }
    if (u.uprops[0x29].intrinsic != 0) {
      pcVar3 = body_part(3);
      pcVar3 = makeplural(pcVar3);
      pline("You can\'t take off the slippery %s with your slippery %s.","gloves",pcVar3);
      return 0;
    }
  }
  if (otmp == uarmf) {
    if ((u.utrap != 0) && (u.utraptype == 0)) {
      pcVar3 = body_part(5);
      pline("The bear trap prevents you from pulling your %s out.",pcVar3);
      return 0;
    }
    if ((u.utrap != 0) && (u.utraptype == 4)) {
      pcVar3 = surface((int)u.ux,(int)u.uy);
      pcVar4 = body_part(5);
      pcVar4 = makeplural(pcVar4);
      pline("You are stuck in the %s, and cannot pull your %s out.",pcVar3,pcVar4);
      return 0;
    }
  }
  if ((otmp == uarm) || (otmp == uarmu)) {
    local_20 = (obj *)0x0;
    if ((uarmc == (obj *)0x0) || ((*(uint *)&uarmc->field_0x4a & 1) == 0)) {
      if (((otmp == uarmu) && (uarm != (obj *)0x0)) && ((*(uint *)&uarm->field_0x4a & 1) != 0)) {
        sprintf(local_128,"remove your %s","suit");
        local_20 = uarm;
      }
      else {
        iVar2 = welded(uwep);
        if ((iVar2 != 0) &&
           (((uwep->oclass == '\x02' || (uwep->oclass == '\x06')) &&
            ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) != 0)))) {
          if (((uwep->oclass == '\x02') && ('\x04' < objects[uwep->otyp].oc_subtyp)) &&
             (objects[uwep->otyp].oc_subtyp < '\v')) {
            local_158 = "sword";
          }
          else {
            local_158 = "weapon";
            if (uwep->otyp == 0x1c) {
              local_158 = "axe";
            }
          }
          sprintf(local_128,"release your %s",local_158);
          local_20 = uwep;
        }
      }
    }
    else {
      pcVar3 = cloak_simple_name(uarmc);
      sprintf(local_128,"remove your %s",pcVar3);
      local_20 = uarmc;
    }
    if (local_20 != (obj *)0x0) {
      pcVar3 = xname(otmp);
      pcVar3 = the(pcVar3);
      pline("You cannot %s to take off %s.",local_128,pcVar3);
      *(uint *)&local_20->field_0x4a = *(uint *)&local_20->field_0x4a & 0xffffffbf | 0x40;
      return 0;
    }
  }
  if ((otmp == uquiver) ||
     (((otmp == uswapwep && (u.twoweap == '\0')) || (iVar2 = cursed(otmp), iVar2 == 0)))) {
    if (otmp == uarm) {
      takeoff_mask = takeoff_mask | 1;
    }
    else if (otmp == uarmc) {
      takeoff_mask = takeoff_mask | 2;
    }
    else if (otmp == uarmf) {
      takeoff_mask = takeoff_mask | 0x20;
    }
    else if (otmp == uarmg) {
      takeoff_mask = takeoff_mask | 0x10;
    }
    else if (otmp == uarmh) {
      takeoff_mask = takeoff_mask | 4;
    }
    else if (otmp == uarms) {
      takeoff_mask = takeoff_mask | 8;
    }
    else if (otmp == uarmu) {
      takeoff_mask = takeoff_mask | 0x40;
    }
    else if (otmp == uleft) {
      takeoff_mask = takeoff_mask | 0x20000;
    }
    else if (otmp == uright) {
      takeoff_mask = takeoff_mask | 0x40000;
    }
    else if (otmp == uamul) {
      takeoff_mask = takeoff_mask | 0x10000;
    }
    else if (otmp == ublindf) {
      takeoff_mask = takeoff_mask | 0x80000;
    }
    else if (otmp == uwep) {
      takeoff_mask = takeoff_mask | 0x100;
    }
    else if (otmp == uswapwep) {
      takeoff_mask = takeoff_mask | 0x400;
    }
    else if (otmp == uquiver) {
      takeoff_mask = takeoff_mask | 0x200;
    }
    else {
      pcVar3 = doname(otmp);
      warning("select_off: %s???",pcVar3);
    }
  }
  return 0;
}

Assistant:

static int select_off(struct obj *otmp)
{
	struct obj *why;
	char buf[BUFSZ];

	if (!otmp) return 0;
	*buf = '\0';			/* lint suppresion */

	/* special ring checks */
	if (otmp == uright || otmp == uleft) {
	    if (nolimbs(youmonst.data)) {
		pline("The ring is stuck.");
		return 0;
	    }
	    why = 0;	/* the item which prevents ring removal */
	    if (welded(uwep) && (otmp == uright || bimanual(uwep))) {
		sprintf(buf, "free a weapon %s", body_part(HAND));
		why = uwep;
	    } else if (uarmg && uarmg->cursed) {
		sprintf(buf, "take off your %s", c_gloves);
		why = uarmg;
	    }
	    if (why) {
		pline("You cannot %s to remove the ring.", buf);
		why->bknown = TRUE;
		return 0;
	    }
	}
	/* special glove checks */
	if (otmp == uarmg) {
	    if (welded(uwep)) {
		pline("You are unable to take off your %s while wielding that %s.",
		    c_gloves, is_sword(uwep) ? c_sword : c_weapon);
		uwep->bknown = TRUE;
		return 0;
	    } else if (Glib) {
		pline("You can't take off the slippery %s with your slippery %s.",
			 c_gloves, makeplural(body_part(FINGER)));
		return 0;
	    }
	}
	/* special boot checks */
	if (otmp == uarmf) {
	    if (u.utrap && u.utraptype == TT_BEARTRAP) {
		pline("The bear trap prevents you from pulling your %s out.",
			  body_part(FOOT));
		return 0;
	    } else if (u.utrap && u.utraptype == TT_INFLOOR) {
		pline("You are stuck in the %s, and cannot pull your %s out.",
		    surface(u.ux, u.uy), makeplural(body_part(FOOT)));
		return 0;
	    }
	}
	/* special suit and shirt checks */
	if (otmp == uarm || otmp == uarmu) {
	    why = 0;	/* the item which prevents disrobing */
	    if (uarmc && uarmc->cursed) {
		sprintf(buf, "remove your %s", cloak_simple_name(uarmc));
		why = uarmc;
	    } else if (otmp == uarmu && uarm && uarm->cursed) {
		sprintf(buf, "remove your %s", c_suit);
		why = uarm;
	    } else if (welded(uwep) && bimanual(uwep)) {
		sprintf(buf, "release your %s",
			is_sword(uwep) ? c_sword :
			(uwep->otyp == BATTLE_AXE) ? c_axe : c_weapon);
		why = uwep;
	    }
	    if (why) {
		pline("You cannot %s to take off %s.", buf, the(xname(otmp)));
		why->bknown = TRUE;
		return 0;
	    }
	}
	/* basic curse check */
	if (otmp == uquiver || (otmp == uswapwep && !u.twoweap)) {
	    ;	/* some items can be removed even when cursed */
	} else {
	    /* otherwise, this is fundamental */
	    if (cursed(otmp)) return 0;
	}

	if (otmp == uarm) takeoff_mask |= WORN_ARMOR;
	else if (otmp == uarmc) takeoff_mask |= WORN_CLOAK;
	else if (otmp == uarmf) takeoff_mask |= WORN_BOOTS;
	else if (otmp == uarmg) takeoff_mask |= WORN_GLOVES;
	else if (otmp == uarmh) takeoff_mask |= WORN_HELMET;
	else if (otmp == uarms) takeoff_mask |= WORN_SHIELD;
	else if (otmp == uarmu) takeoff_mask |= WORN_SHIRT;
	else if (otmp == uleft) takeoff_mask |= LEFT_RING;
	else if (otmp == uright) takeoff_mask |= RIGHT_RING;
	else if (otmp == uamul) takeoff_mask |= WORN_AMUL;
	else if (otmp == ublindf) takeoff_mask |= WORN_BLINDF;
	else if (otmp == uwep) takeoff_mask |= W_WEP;
	else if (otmp == uswapwep) takeoff_mask |= W_SWAPWEP;
	else if (otmp == uquiver) takeoff_mask |= W_QUIVER;

	else warning("select_off: %s???", doname(otmp));

	return 0;
}